

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O1

void PrintAllSpecies(N_Vector c,int ns,int mxns,sunrealtype t)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  lVar2 = N_VGetArrayPointer();
  printf("c values at t = %g:\n\n",t);
  if (0 < ns) {
    iVar7 = mxns * 5;
    iVar4 = 1;
    do {
      printf("Species %d\n");
      iVar1 = 5;
      iVar6 = iVar7;
      do {
        lVar3 = 6;
        iVar5 = iVar6;
        do {
          printf("%-10.6g",*(undefined8 *)(lVar2 + (long)iVar5 * 8));
          iVar5 = iVar5 + ns;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
        putchar(10);
        iVar6 = iVar6 - mxns;
        bVar8 = iVar1 != 0;
        iVar1 = iVar1 + -1;
      } while (bVar8);
      putchar(10);
      iVar7 = iVar7 + 1;
      bVar8 = iVar4 != ns;
      iVar4 = iVar4 + 1;
    } while (bVar8);
  }
  return;
}

Assistant:

static void PrintAllSpecies(N_Vector c, int ns, int mxns, sunrealtype t)
{
  int i, jx, jy;
  sunrealtype* cdata;

  cdata = N_VGetArrayPointer(c);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("c values at t = %Lg:\n\n", t);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("c values at t = %g:\n\n", t);
#else
  printf("c values at t = %g:\n\n", t);
#endif
  for (i = 1; i <= ns; i++)
  {
    printf("Species %d\n", i);
    for (jy = MY - 1; jy >= 0; jy--)
    {
      for (jx = 0; jx < MX; jx++)
      {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        printf("%-10.6Lg", cdata[(i - 1) + jx * ns + jy * mxns]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        printf("%-10.6g", cdata[(i - 1) + jx * ns + jy * mxns]);
#else
        printf("%-10.6g", cdata[(i - 1) + jx * ns + jy * mxns]);
#endif
      }
      printf("\n");
    }
    printf("\n");
  }
}